

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.h
# Opt level: O1

void __thiscall
gmlc::networking::TcpConnection::TcpConnection
          (TcpConnection *this,SocketFactory *sf,io_context *io_context,size_t bufferSize)

{
  int iVar1;
  allocator_type local_19;
  
  (this->super_enable_shared_from_this<gmlc::networking::TcpConnection>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<gmlc::networking::TcpConnection>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->residBufferSize).super___atomic_base<unsigned_long>._M_i = 0;
  SocketFactory::create_socket((SocketFactory *)&this->socket_,(io_context *)sf);
  this->context_ = io_context;
  std::vector<char,_std::allocator<char>_>::vector(&this->data,bufferSize,&local_19);
  this->triggerhalt = (__atomic_base<bool>)0x0;
  this->connecting = false;
  (this->receivingHalt).triggered._M_base._M_i = false;
  (this->receivingHalt).activeLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->receivingHalt).activeLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->receivingHalt).activeLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->receivingHalt).activeLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->receivingHalt).activeLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->receivingHalt).triggerLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->receivingHalt).triggerLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->receivingHalt).triggerLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->receivingHalt).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->receivingHalt).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev + 1) =
       0;
  *(undefined8 *)
   ((long)&(this->receivingHalt).triggerLock.super___mutex_base._M_mutex.__data.__list.__next + 1) =
       0;
  std::condition_variable::condition_variable(&(this->receivingHalt).cv_trigger);
  std::condition_variable::condition_variable(&(this->receivingHalt).cv_active);
  (this->connectionError)._M_base._M_i = false;
  (this->connected).triggered._M_base._M_i = false;
  (this->connected).activeLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->connected).activeLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->connected).activeLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->connected).activeLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->connected).activeLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->connected).triggerLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->connected).triggerLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->connected).triggerLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->connected).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->connected).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)
   ((long)&(this->connected).triggerLock.super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  std::condition_variable::condition_variable(&(this->connected).cv_trigger);
  std::condition_variable::condition_variable(&(this->connected).cv_active);
  (this->logFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->logFunction)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->logFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->logFunction).super__Function_base._M_functor + 8) = 0;
  (this->errorCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->errorCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->errorCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->errorCall).super__Function_base._M_functor + 8) = 0;
  (this->dataCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->dataCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->dataCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->dataCall).super__Function_base._M_functor + 8) = 0;
  (this->state)._M_i = PRESTART;
  LOCK();
  UNLOCK();
  iVar1 = idcounter + 1;
  this->idcode = idcounter;
  idcounter = iVar1;
  return;
}

Assistant:

TcpConnection(
            const SocketFactory& sf,
            asio::io_context& io_context,
            size_t bufferSize) :
            socket_(sf.create_socket(io_context)), context_(io_context),
            data(bufferSize), idcode(idcounter++)
        {
        }